

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int load_data(void)

{
  int iVar1;
  DATA_ENTRY *d;
  int unaff_EBX;
  char *ext;
  
  if (demo_data == (DATA_ENTRY *)0x0) {
    ext = (char *)0x0;
    d = (DATA_ENTRY *)calloc(0x24,0x40);
    load(d,0,"bitmap","menu","back","png",ext,unaff_EBX);
    load(d,1,"font","menu","cancunsmall","png",ext,unaff_EBX);
    load(d,2,"font","menu","logofont","png",ext,unaff_EBX);
    load(d,3,"music","menu","skate2","ogg",ext,unaff_EBX);
    load(d,4,"music","menu","intro_music","ogg",ext,unaff_EBX);
    load(d,5,"music","menu","menu_music","ogg",ext,unaff_EBX);
    load(d,6,"music","menu","endoflevel","ogg",ext,unaff_EBX);
    load(d,7,"sample","menu","button","ogg",ext,unaff_EBX);
    load(d,8,"sample","menu","welcome","ogg",ext,unaff_EBX);
    load(d,9,"sample","audio","skating","ogg",ext,unaff_EBX);
    load(d,10,"sample","audio","wave","ogg",ext,unaff_EBX);
    load(d,0xb,"sample","audio","ding","ogg",ext,unaff_EBX);
    load(d,0xc,"sample","audio","dooropen","ogg",ext,unaff_EBX);
    load(d,0xd,"sample","audio","pop","ogg",ext,unaff_EBX);
    load(d,0xe,"bitmap","graphics","bananas","png",ext,unaff_EBX);
    load(d,0xf,"bitmap","graphics","cherries","png",ext,unaff_EBX);
    load(d,0x10,"bitmap","graphics","cloud","png",ext,unaff_EBX);
    load(d,0x11,"bitmap","graphics","dooropen","png",ext,unaff_EBX);
    load(d,0x12,"bitmap","graphics","doorshut","png",ext,unaff_EBX);
    load(d,0x13,"bitmap","graphics","exitsign","png",ext,unaff_EBX);
    load(d,0x14,"bitmap","graphics","grass","png",ext,unaff_EBX);
    load(d,0x15,"bitmap","graphics","icecream","png",ext,unaff_EBX);
    load(d,0x16,"bitmap","graphics","ice","png",ext,unaff_EBX);
    load(d,0x17,"bitmap","graphics","icetip","png",ext,unaff_EBX);
    load(d,0x18,"bitmap","graphics","orange","png",ext,unaff_EBX);
    load(d,0x19,"bitmap","graphics","skatefast","png",ext,unaff_EBX);
    load(d,0x1a,"bitmap","graphics","skatemed","png",ext,unaff_EBX);
    load(d,0x1b,"bitmap","graphics","skater1","png",ext,unaff_EBX);
    load(d,0x1c,"bitmap","graphics","skater2","png",ext,unaff_EBX);
    load(d,0x1d,"bitmap","graphics","skater3","png",ext,unaff_EBX);
    load(d,0x1e,"bitmap","graphics","skater4","png",ext,unaff_EBX);
    load(d,0x1f,"bitmap","graphics","skateslow","png",ext,unaff_EBX);
    load(d,0x20,"bitmap","graphics","soil","png",ext,unaff_EBX);
    load(d,0x21,"bitmap","graphics","sweet","png",ext,unaff_EBX);
    load(d,0x22,"bitmap","graphics","water","png",ext,unaff_EBX);
    iVar1 = 6;
    demo_data = d;
    if (d != (DATA_ENTRY *)0x0) {
      GameError = load_game_resources(data_path);
      iVar1 = 7;
      if (GameError == (char *)0x0) {
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  return 0;
}

Assistant:

int load_data(void)
{
   if (demo_data)
      return DEMO_OK;

   /* Load the data for the game menus. */
   demo_data = load_data_entries(data_path);
   if (demo_data == 0) {
      return DEMO_ERROR_DATA;
   }

   /* Load other game resources. */
   if ((GameError = load_game_resources(data_path)))
      return DEMO_ERROR_GAMEDATA;

   return DEMO_OK;
}